

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int solution(set<int,_std::less<int>,_std::allocator<int>_> *nodes,
            map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
            *inc,map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
                 *r_inc)

{
  size_t *psVar1;
  _Rb_tree_node_base *__k;
  int iVar2;
  undefined1 auVar3 [8];
  undefined8 *puVar4;
  undefined8 *puVar5;
  _Self __tmp_1;
  _List_node_base *p_Var6;
  mapped_type *pmVar7;
  _Rb_tree_node_base *p_Var8;
  long *plVar9;
  mapped_type *__x;
  _List_node_base *p_Var10;
  mapped_type *pmVar11;
  _Self __tmp;
  int iVar12;
  int iVar13;
  undefined1 local_a8 [8];
  list<int,_std::allocator<int>_> l;
  undefined1 local_80 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> n;
  list<int,_std::allocator<int>_> starts;
  
  n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&n;
  n._M_t._M_impl._0_4_ = 0;
  n._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  n._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  n._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  n._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&n._M_t._M_impl.super__Rb_tree_header._M_node_count;
  n._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  for (p_Var8 = (nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(nodes->_M_t)._M_impl.super__Rb_tree_header;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    __k = p_Var8 + 1;
    p_Var6 = (_List_node_base *)
             std::
             map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
             ::operator[](r_inc,(key_type *)__k);
    if ((((_List_base<int,_std::allocator<int>_> *)&p_Var6->_M_next)->_M_impl)._M_node.
        super__List_node_base._M_next == p_Var6) {
      p_Var6 = (_List_node_base *)operator_new(0x18);
      *(_Rb_tree_color *)&p_Var6[1]._M_next = __k->_M_color;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)local_80,(key_type *)__k);
      *pmVar7 = 1;
    }
  }
  if (&n._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (size_t *)n._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    __assert_fail("starts.end() != k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/medium/dwarfs/main.cpp"
                  ,0x20,
                  "int solution(std::set<int> &, std::map<int, std::list<int>> &, std::map<int, std::list<int>> &)"
                 );
  }
  starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
       n._M_t._M_impl.super__Rb_tree_header._M_node_count;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"process ",8);
    plVar9 = (long *)std::ostream::operator<<
                               ((ostream *)&std::cerr,
                                *(int *)(starts.super__List_base<int,_std::allocator<int>_>._M_impl.
                                         _M_node._M_size + 0x10));
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    l.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
         starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size + 0x10;
    __x = std::
          map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
          ::operator[](inc,(key_type *)
                           l.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
    std::__cxx11::list<int,_std::allocator<int>_>::list
              ((list<int,_std::allocator<int>_> *)local_a8,__x);
    for (auVar3 = local_a8; auVar3 != (undefined1  [8])local_a8;
        auVar3 = (undefined1  [8])
                 (((_List_base<int,_std::allocator<int>_> *)&((_List_node_base *)auVar3)->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next) {
      p_Var6 = (_List_node_base *)((long)auVar3 + 0x10);
      pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)local_80,(key_type *)p_Var6);
      if (*pmVar7 == 0) {
        p_Var10 = (_List_node_base *)operator_new(0x18);
        *(key_type *)&p_Var10[1]._M_next = *(key_type *)&p_Var6->_M_next;
        std::__detail::_List_node_base::_M_hook(p_Var10);
      }
      pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)local_80,(key_type *)p_Var6);
      pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)local_80,
                           (key_type *)
                           l.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
      iVar13 = *pmVar11;
      iVar2 = *pmVar7;
      pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)local_80,(key_type *)p_Var6);
      iVar12 = iVar13 + 1;
      if (iVar13 + 1 < iVar2) {
        iVar12 = iVar2;
      }
      *pmVar7 = iVar12;
    }
    starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
         *(size_t *)starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
    p_Var8 = n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = (_List_node_base *)local_a8;
    while (n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var8,
          p_Var6 != (_List_node_base *)local_a8) {
      p_Var10 = p_Var6->_M_next;
      operator_delete(p_Var6,0x18);
      p_Var8 = n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = p_Var10;
    }
    psVar1 = &n._M_t._M_impl.super__Rb_tree_header._M_node_count;
  } while (psVar1 != (size_t *)
                     starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
  iVar13 = 0;
  puVar5 = (undefined8 *)n._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (p_Var8 != (_Rb_tree_node_base *)&n) {
    do {
      if (iVar13 < *(int *)&p_Var8[1].field_0x4) {
        iVar13 = *(int *)&p_Var8[1].field_0x4;
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      puVar5 = (undefined8 *)n._M_t._M_impl.super__Rb_tree_header._M_node_count;
    } while (p_Var8 != (_Rb_tree_node_base *)&n);
  }
  while (puVar5 != psVar1) {
    puVar4 = (undefined8 *)*puVar5;
    operator_delete(puVar5,0x18);
    puVar5 = puVar4;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_80);
  return iVar13;
}

Assistant:

int solution(std::set<int>& nodes, std::map<int, std::list<int> >& inc, std::map<int, std::list<int> >& r_inc)
{
    std::map<int, int> n;
    std::list<int> starts;
    
    for (std::set<int>::const_iterator i = nodes.begin(); i != nodes.end(); i++)
    {
        if (r_inc[*i].empty())
        {
            starts.push_back(*i);
            n[*i] = 1;
        }
    }
    
    std::list<int>::const_iterator k = starts.begin();
    assert(starts.end() != k);
    while (starts.end() != k)
    {
        cerr << "process " << *k << endl;
        std::list<int> l = inc[*k];
        for (std::list<int>::const_iterator j = l.begin(); j != l.end(); j++)
        {
            if (0 == n[*j])
            {
                starts.push_back(*j);
            }
            n[*j] = std::max(n[*j], n[*k] + 1);
        }
        k++;
    }
    
    int max = 0;
    for (std::map<int, int>::const_iterator i = n.begin(); i != n.end(); i++)
    {
        if (i->second > max)
        {
            max = i->second;
        }
    }
    return max;
}